

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

int arkInterpResize_Hermite
              (ARKodeMem_conflict ark_mem,ARKInterp interp,ARKVecResizeFn resize,void *resize_data,
              sunindextype lrw_diff,sunindextype liw_diff,N_Vector y0)

{
  int iVar1;
  ARKodeMem in_RCX;
  long *in_RSI;
  N_Vector *in_RDI;
  ARKVecResizeFn in_R8;
  void *in_R9;
  sunindextype in_stack_ffffffffffffffc0;
  int local_4;
  
  if (in_RSI == (long *)0x0) {
    local_4 = 0;
  }
  else {
    iVar1 = arkResizeVec(in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,*in_RSI + 8,(N_Vector)0x14b18f
                         ,in_RDI);
    if (iVar1 == 0) {
      local_4 = -0x14;
    }
    else {
      iVar1 = arkResizeVec(in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,*in_RSI + 0x10,
                           (N_Vector)0x14b1d4,in_RDI);
      if (iVar1 == 0) {
        local_4 = -0x14;
      }
      else {
        iVar1 = arkResizeVec(in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,*in_RSI + 0x18,
                             (N_Vector)0x14b219,in_RDI);
        if (iVar1 == 0) {
          local_4 = -0x14;
        }
        else {
          iVar1 = arkResizeVec(in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,*in_RSI + 0x20,
                               (N_Vector)0x14b25e,in_RDI);
          if (iVar1 == 0) {
            local_4 = -0x14;
          }
          else {
            *(N_Vector *)(*in_RSI + 0x28) = in_RDI[0x5a];
            *(N_Vector *)(*in_RSI + 0x30) = in_RDI[0x5a];
            *(undefined8 *)(*in_RSI + 0x38) = 0;
            local_4 = 0;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int arkInterpResize_Hermite(ARKodeMem ark_mem, ARKInterp interp,
                            ARKVecResizeFn resize, void* resize_data,
                            sunindextype lrw_diff, sunindextype liw_diff,
                            N_Vector y0)
{
  /* resize vectors */
  if (interp == NULL) { return (ARK_SUCCESS); }

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                    &HINT_FOLD(interp)))
  {
    return (ARK_MEM_FAIL);
  }

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                    &HINT_YOLD(interp)))
  {
    return (ARK_MEM_FAIL);
  }

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                    &HINT_FA(interp)))
  {
    return (ARK_MEM_FAIL);
  }

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                    &HINT_FB(interp)))
  {
    return (ARK_MEM_FAIL);
  }

  /* reinitialize time values */
  HINT_TOLD(interp) = ark_mem->tcur;
  HINT_TNEW(interp) = ark_mem->tcur;
  HINT_H(interp)    = SUN_RCONST(0.0);

  return (ARK_SUCCESS);
}